

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiScrollFlags scroll_flags;
  
  pIVar2 = GImGui;
  ppIVar1 = &GImGui->CurrentWindow;
  GImGui->NavWindow = *ppIVar1;
  scroll_flags = 3;
  if ((*ppIVar1)->Appearing != false) {
    scroll_flags = 0x21;
  }
  NavMoveRequestSubmit(-1,(uint)offset >> 0x1f ^ 3,0x600,scroll_flags);
  if (offset == -1) {
    GImGui->NavMoveScoringItems = false;
    NavApplyItemToResult(&pIVar2->NavMoveResultLocal);
    bVar3 = true;
    if (GImGui->NavMoveScoringItems == false) {
      bVar3 = GImGui->NavInitRequest;
    }
    GImGui->NavAnyRequest = bVar3;
  }
  else {
    pIVar2->NavTabbingDir = 1;
    pIVar2->NavTabbingCounter = offset + 1;
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    g.NavWindow = window;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, ImGuiNavMoveFlags_Tabbing | ImGuiNavMoveFlags_FocusApi, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}